

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O3

ngx_int_t ngx_parse_time(ngx_str_t *line,ngx_uint_t is_sec)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  byte *pbVar4;
  ngx_int_t nVar5;
  byte bVar6;
  byte bVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if ((long)line->len < 1) {
    return -1;
  }
  pbVar2 = line->data;
  pbVar8 = pbVar2 + line->len;
  bVar7 = (is_sec == 0) * '\x02';
  bVar1 = false;
  lVar10 = 0;
  do {
    bVar6 = *pbVar2;
    if ((byte)(bVar6 - 0x30) < 10) {
      lVar11 = 0;
      do {
        pbVar2 = pbVar2 + 1;
        if (0xccccccccccccccb < lVar11) {
          if (lVar11 != 0xccccccccccccccc) {
            return -1;
          }
          if ((bVar6 & 8) != 0) {
            return -1;
          }
        }
        lVar11 = (ulong)bVar6 + lVar11 * 10 + -0x30;
        if (pbVar8 <= pbVar2) {
          if (is_sec != 0) goto LAB_00118965;
          if (0x20c49ba5e353f7 < lVar11) {
            return -1;
          }
          goto LAB_0011895e;
        }
        bVar6 = *pbVar2;
      } while ((byte)(bVar6 - 0x30) < 10);
      bVar1 = true;
    }
    else {
      lVar11 = 0;
    }
    pbVar4 = pbVar2 + 1;
    if (bVar6 < 0x6d) {
      if (bVar6 < 100) {
        if (bVar6 == 0x20) {
          if (6 < bVar7) {
            return -1;
          }
          bVar7 = 9;
LAB_0011883e:
          lVar9 = 1;
          uVar3 = 0x7fffffffffffffff;
        }
        else {
          if (bVar6 != 0x4d) {
            return -1;
          }
          if (1 < bVar7) {
            return -1;
          }
          bVar7 = 2;
          lVar9 = 0x278d00;
          uVar3 = 0x33c812681e8;
        }
      }
      else if (bVar6 == 100) {
        if (3 < bVar7) {
          return -1;
        }
        bVar7 = 4;
        lVar9 = 0x15180;
        uVar3 = 0x611722833944;
      }
      else {
        if (bVar6 != 0x68) {
          return -1;
        }
        if (4 < bVar7) {
          return -1;
        }
        bVar7 = 5;
        lVar9 = 0xe10;
        uVar3 = 0x91a2b3c4d5e6f;
      }
LAB_001188df:
      if (is_sec == 0) {
        lVar9 = lVar9 * 1000;
        uVar3 = uVar3 / 1000;
      }
    }
    else {
      if (0x76 < bVar6) {
        if (bVar6 == 0x77) {
          if (2 < bVar7) {
            return -1;
          }
          bVar7 = 3;
          lVar9 = 0x93a80;
          uVar3 = 0xddebbc99a77;
        }
        else {
          if (bVar6 != 0x79) {
            return -1;
          }
          if (bVar7 != 0) {
            return -1;
          }
          bVar7 = 1;
          lVar9 = 0x1e13380;
          uVar3 = 0x4418a47ae5;
        }
        goto LAB_001188df;
      }
      if (bVar6 != 0x6d) {
        if (bVar6 != 0x73) {
          return -1;
        }
        if (6 < bVar7) {
          return -1;
        }
        bVar7 = 7;
        goto LAB_0011883e;
      }
      if ((pbVar8 <= pbVar4) || (*pbVar4 != 0x73)) {
        if (5 < bVar7) {
          return -1;
        }
        bVar7 = 6;
        lVar9 = 0x3c;
        uVar3 = 0x222222222222222;
        goto LAB_001188df;
      }
      if (is_sec != 0) {
        return -1;
      }
      if (7 < bVar7) {
        return -1;
      }
      pbVar4 = pbVar2 + 2;
      lVar9 = 1;
      bVar7 = 8;
      uVar3 = 0x7fffffffffffffff;
    }
    if ((long)uVar3 < lVar11) {
      return -1;
    }
    pbVar2 = pbVar4;
    if (0x7fffffffffffffff - lVar9 * lVar11 < lVar10) {
      return -1;
    }
    for (; (pbVar2 < pbVar8 && (*pbVar2 == 0x20)); pbVar2 = pbVar2 + 1) {
    }
    lVar10 = lVar9 * lVar11 + lVar10;
    if (pbVar8 <= pbVar2) {
      nVar5 = -1;
      if (bVar1) {
        lVar11 = 0;
        if (is_sec == 0) {
LAB_0011895e:
          lVar11 = lVar11 * 1000;
        }
LAB_00118965:
        nVar5 = -1;
        if (lVar10 <= 0x7fffffffffffffff - lVar11) {
          nVar5 = lVar11 + lVar10;
        }
      }
      return nVar5;
    }
  } while( true );
}

Assistant:

ngx_int_t
ngx_parse_time(ngx_str_t *line, ngx_uint_t is_sec)
{
    u_char      *p, *last;
    ngx_int_t    value, total, scale;
    ngx_int_t    max, cutoff, cutlim;
    ngx_uint_t   valid;
    enum {
        st_start = 0,
        st_year,
        st_month,
        st_week,
        st_day,
        st_hour,
        st_min,
        st_sec,
        st_msec,
        st_last
    } step;

    valid = 0;
    value = 0;
    total = 0;
    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;
    step = is_sec ? st_start : st_month;

    p = line->data;
    last = p + line->len;

    while (p < last) {

        if (*p >= '0' && *p <= '9') {
            if (value >= cutoff && (value > cutoff || *p - '0' > cutlim)) {
                return NGX_ERROR;
            }

            value = value * 10 + (*p++ - '0');
            valid = 1;
            continue;
        }

        switch (*p++) {

        case 'y':
            if (step > st_start) {
                return NGX_ERROR;
            }
            step = st_year;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 365);
            scale = 60 * 60 * 24 * 365;
            break;

        case 'M':
            if (step >= st_month) {
                return NGX_ERROR;
            }
            step = st_month;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 30);
            scale = 60 * 60 * 24 * 30;
            break;

        case 'w':
            if (step >= st_week) {
                return NGX_ERROR;
            }
            step = st_week;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 7);
            scale = 60 * 60 * 24 * 7;
            break;

        case 'd':
            if (step >= st_day) {
                return NGX_ERROR;
            }
            step = st_day;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24);
            scale = 60 * 60 * 24;
            break;

        case 'h':
            if (step >= st_hour) {
                return NGX_ERROR;
            }
            step = st_hour;
            max = NGX_MAX_INT_T_VALUE / (60 * 60);
            scale = 60 * 60;
            break;

        case 'm':
            if (p < last && *p == 's') {
                if (is_sec || step >= st_msec) {
                    return NGX_ERROR;
                }
                p++;
                step = st_msec;
                max = NGX_MAX_INT_T_VALUE;
                scale = 1;
                break;
            }

            if (step >= st_min) {
                return NGX_ERROR;
            }
            step = st_min;
            max = NGX_MAX_INT_T_VALUE / 60;
            scale = 60;
            break;

        case 's':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_sec;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        case ' ':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_last;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        default:
            return NGX_ERROR;
        }

        if (step != st_msec && !is_sec) {
            scale *= 1000;
            max /= 1000;
        }

        if (value > max) {
            return NGX_ERROR;
        }

        value *= scale;

        if (total > NGX_MAX_INT_T_VALUE - value) {
            return NGX_ERROR;
        }

        total += value;

        value = 0;

        while (p < last && *p == ' ') {
            p++;
        }
    }

    if (!valid) {
        return NGX_ERROR;
    }

    if (!is_sec) {
        if (value > NGX_MAX_INT_T_VALUE / 1000) {
            return NGX_ERROR;
        }

        value *= 1000;
    }

    if (total > NGX_MAX_INT_T_VALUE - value) {
        return NGX_ERROR;
    }

    return total + value;
}